

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

char * Wlc_PrsReadName(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins)

{
  Wlc_Ntk_t *p_00;
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  Wlc_Obj_t *pWVar4;
  char *local_b8;
  char *pName;
  Vec_Int_t *vFanins_1;
  int local_a0;
  int XValue;
  int Signed;
  int Range;
  char Buffer [100];
  int iObj;
  int fFound;
  int NameId;
  Vec_Int_t *vFanins_local;
  char *pStr_local;
  Wlc_Prs_t *p_local;
  
  pcVar3 = Wlc_PrsSkipSpaces(pStr);
  iVar2 = Wlc_PrsIsDigit(pcVar3);
  if (iVar2 == 0) {
    vFanins_local = (Vec_Int_t *)Wlc_PrsFindName(pcVar3,&local_b8);
    if (vFanins_local == (Vec_Int_t *)0x0) {
      iVar2 = Wlc_PrsWriteErrorMessage(p,(char *)0x0,"Cannot read name in assign-statement.");
      return (char *)(long)iVar2;
    }
    iObj = Abc_NamStrFindOrAdd(p->pNtk->pManName,local_b8,(int *)(Buffer + 0x60));
    if (Buffer._96_4_ == 0) {
      iVar2 = Wlc_PrsWriteErrorMessage
                        (p,(char *)vFanins_local,"Name %s is used but not declared.",local_b8);
      return (char *)(long)iVar2;
    }
  }
  else {
    vFanins_1._4_4_ = 0;
    pName = (char *)Vec_IntAlloc(0);
    vFanins_local =
         (Vec_Int_t *)
         Wlc_PrsReadConstant(p,pcVar3,(Vec_Int_t *)pName,&XValue,&local_a0,
                             (int *)((long)&vFanins_1 + 4));
    if (vFanins_local == (Vec_Int_t *)0x0) {
      Vec_IntFree((Vec_Int_t *)pName);
      return (char *)0x0;
    }
    Buffer._92_4_ = Wlc_ObjAlloc(p->pNtk,6,local_a0,XValue + -1,0);
    p_00 = p->pNtk;
    pWVar4 = Wlc_NtkObj(p->pNtk,Buffer._92_4_);
    Wlc_ObjAddFanins(p_00,pWVar4,(Vec_Int_t *)pName);
    uVar1 = vFanins_1._4_4_;
    pWVar4 = Wlc_NtkObj(p->pNtk,Buffer._92_4_);
    *(ushort *)pWVar4 = *(ushort *)pWVar4 & 0xf7ff | ((ushort)uVar1 & 1) << 0xb;
    Vec_IntFree((Vec_Int_t *)pName);
    p->nConsts = p->nConsts + 1;
    sprintf((char *)&Signed,"_c%d_");
    iObj = Abc_NamStrFindOrAdd(p->pNtk->pManName,(char *)&Signed,(int *)(Buffer + 0x60));
    if (Buffer._96_4_ != 0) {
      iVar2 = Wlc_PrsWriteErrorMessage(p,(char *)vFanins_local,"Name %s is already used.",&Signed);
      return (char *)(long)iVar2;
    }
    if (Buffer._92_4_ != iObj) {
      __assert_fail("iObj == NameId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                    ,0x291,"char *Wlc_PrsReadName(Wlc_Prs_t *, char *, Vec_Int_t *)");
    }
  }
  Vec_IntPush(vFanins,iObj);
  pcVar3 = Wlc_PrsSkipSpaces((char *)vFanins_local);
  return pcVar3;
}

Assistant:

static inline char * Wlc_PrsReadName( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins )
{
    int NameId, fFound, iObj;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsIsDigit(pStr) )
    {
        char Buffer[100];
        int Range, Signed, XValue = 0;
        Vec_Int_t * vFanins = Vec_IntAlloc(0);
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, &XValue );
        if ( pStr == NULL )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
        // create new node
        iObj = Wlc_ObjAlloc( p->pNtk, WLC_OBJ_CONST, Signed, Range-1, 0 );
        Wlc_ObjAddFanins( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), vFanins );
        Wlc_NtkObj(p->pNtk, iObj)->fXConst = XValue;
        Vec_IntFree( vFanins );
        // add node's name
        sprintf( Buffer, "_c%d_", p->nConsts++ );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, Buffer, &fFound );
        if ( fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is already used.", Buffer );
        assert( iObj == NameId );
    }
    else
    {
        char * pName;
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr == NULL )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in assign-statement." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( !fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is used but not declared.", pName );
    }
    Vec_IntPush( vFanins, NameId );
    return Wlc_PrsSkipSpaces( pStr );
}